

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

void __thiscall
fasttext::Args::parseArgs
          (Args *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  ostream *poVar5;
  int iVar6;
  size_type __n;
  Args *this_00;
  ulong uVar7;
  float fVar8;
  string command;
  out_of_range anon_var_0;
  
  std::__cxx11::string::string
            ((string *)&command,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1));
  bVar2 = std::operator==(&command,"supervised");
  if (bVar2) {
    this->loss = softmax;
    this->model = sup;
    this->minCount = 1;
    this->minn = 0;
    this->maxn = 0;
    this->lr = 0.1;
  }
  else {
    bVar2 = std::operator==(&command,"cbow");
    if (bVar2) {
      this->model = cbow;
    }
  }
  iVar6 = 2;
LAB_0011c0e9:
  uVar7 = (ulong)iVar6;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar7) {
    if (((this->input)._M_string_length != 0) && ((this->output)._M_string_length != 0)) {
      if ((this->wordNgrams < 2) && (this->maxn == 0)) {
        this->bucket = 0;
      }
      std::__cxx11::string::~string((string *)&command);
      return;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"Empty input or output path.");
    std::endl<char,std::char_traits<char>>(poVar5);
    printHelp(this);
LAB_0011c8ad:
    exit(1);
  }
  if (*pbVar1[uVar7]._M_dataplus._M_p != '-') {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Provided argument without a dash! Usage:");
    std::endl<char,std::char_traits<char>>(poVar5);
    printHelp(this);
    goto LAB_0011c8ad;
  }
  bVar2 = std::operator==(pbVar1 + uVar7,"-h");
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Here is the help! Usage:");
    std::endl<char,std::char_traits<char>>(poVar5);
    printHelp(this);
    goto LAB_0011c8ad;
  }
  bVar2 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar7,"-input");
  if (bVar2) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(args,(long)(iVar6 + 1));
    std::__cxx11::string::string((string *)&anon_var_0,(string *)pvVar4);
    this_00 = this;
LAB_0011c18f:
    std::__cxx11::string::operator=((string *)this_00,(string *)&anon_var_0);
    std::__cxx11::string::~string((string *)&anon_var_0);
  }
  else {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"-output");
    if (bVar2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(args,(long)(iVar6 + 1));
      std::__cxx11::string::string((string *)&anon_var_0,(string *)pvVar4);
      this_00 = (Args *)&this->output;
      goto LAB_0011c18f;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"-lr");
    if (bVar2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(args,(long)(iVar6 + 1));
      fVar8 = std::__cxx11::stof(pvVar4,(size_t *)0x0);
      this->lr = (double)fVar8;
    }
    else {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar7,"-lrUpdateRate");
      if (bVar2) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(args,(long)(iVar6 + 1));
        iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
        this->lrUpdateRate = iVar3;
      }
      else {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar7,"-dim");
        if (bVar2) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(args,(long)(iVar6 + 1));
          iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
          this->dim = iVar3;
        }
        else {
          bVar2 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar7,"-ws");
          if (bVar2) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(args,(long)(iVar6 + 1));
            iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
            this->ws = iVar3;
          }
          else {
            bVar2 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar7,"-epoch");
            if (bVar2) {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(args,(long)(iVar6 + 1));
              iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
              this->epoch = iVar3;
            }
            else {
              bVar2 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar7,"-minCount"
                                     );
              if (bVar2) {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at(args,(long)(iVar6 + 1));
                iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                this->minCount = iVar3;
              }
              else {
                bVar2 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar7,
                                        "-minCountLabel");
                if (bVar2) {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at(args,(long)(iVar6 + 1));
                  iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                  this->minCountLabel = iVar3;
                }
                else {
                  bVar2 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar7,"-neg")
                  ;
                  if (bVar2) {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::at(args,(long)(iVar6 + 1));
                    iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                    this->neg = iVar3;
                  }
                  else {
                    bVar2 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar7,
                                            "-wordNgrams");
                    if (bVar2) {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::at(args,(long)(iVar6 + 1));
                      iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                      this->wordNgrams = iVar3;
                    }
                    else {
                      bVar2 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar7,
                                              "-loss");
                      if (bVar2) {
                        __n = (size_type)(iVar6 + 1);
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::at(args,__n);
                        bVar2 = std::operator==(pvVar4,"hs");
                        if (bVar2) {
                          this->loss = hs;
                        }
                        else {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::at(args,__n);
                          bVar2 = std::operator==(pvVar4,"ns");
                          if (bVar2) {
                            this->loss = ns;
                          }
                          else {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::at(args,__n);
                            bVar2 = std::operator==(pvVar4,"softmax");
                            if (!bVar2) {
                              poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown loss: ");
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::at(args,__n);
                              poVar5 = std::operator<<(poVar5,(string *)pvVar4);
                              std::endl<char,std::char_traits<char>>(poVar5);
                              printHelp(this);
                              goto LAB_0011c8ad;
                            }
                            this->loss = softmax;
                          }
                        }
                      }
                      else {
                        bVar2 = std::operator==((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar7,
                                                "-bucket");
                        if (bVar2) {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::at(args,(long)(iVar6 + 1));
                          iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                          this->bucket = iVar3;
                        }
                        else {
                          bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-minn");
                          if (bVar2) {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::at(args,(long)(iVar6 + 1));
                            iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                            this->minn = iVar3;
                          }
                          else {
                            bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-maxn");
                            if (bVar2) {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::at(args,(long)(iVar6 + 1));
                              iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                              this->maxn = iVar3;
                            }
                            else {
                              bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-thread");
                              if (bVar2) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::at(args,(long)(iVar6 + 1));
                                iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                                this->thread = iVar3;
                              }
                              else {
                                bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-t");
                                if (bVar2) {
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::at(args,(long)(iVar6 + 1));
                                  fVar8 = std::__cxx11::stof(pvVar4,(size_t *)0x0);
                                  this->t = (double)fVar8;
                                }
                                else {
                                  bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-label");
                                  if (bVar2) {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::at(args,(long)(iVar6 + 1));
                                    std::__cxx11::string::string
                                              ((string *)&anon_var_0,(string *)pvVar4);
                                    this_00 = (Args *)&this->label;
                                    goto LAB_0011c18f;
                                  }
                                  bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-verbose");
                                  if (bVar2) {
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::at(args,(long)(iVar6 + 1));
                                    iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                                    this->verbose = iVar3;
                                  }
                                  else {
                                    bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-pretrainedVectors");
                                    if (bVar2) {
                                      pvVar4 = std::
                                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ::at(args,(long)(iVar6 + 1));
                                      std::__cxx11::string::string
                                                ((string *)&anon_var_0,(string *)pvVar4);
                                      this_00 = (Args *)&this->pretrainedVectors;
                                      goto LAB_0011c18f;
                                    }
                                    bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-saveOutput");
                                    if (bVar2) {
                                      this->saveOutput = true;
                                    }
                                    else {
                                      bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-qnorm");
                                      if (bVar2) {
                                        this->qnorm = true;
                                      }
                                      else {
                                        bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-retrain");
                                        if (bVar2) {
                                          this->retrain = true;
                                        }
                                        else {
                                          bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-qout");
                                          if (!bVar2) {
                                            bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-cutoff");
                                            if (bVar2) {
                                              pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at(args,(long)(iVar6 + 1));
                                              iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                                              this->cutoff = (long)iVar3;
                                              goto LAB_0011c19f;
                                            }
                                            bVar2 = std::operator==((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ,"-dsub");
                                            if (!bVar2) {
                                              poVar5 = std::operator<<((ostream *)&std::cerr,
                                                                       "Unknown argument: ");
                                              poVar5 = std::operator<<(poVar5,(string *)
                                                                              ((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar7
                                                  ));
                                              std::endl<char,std::char_traits<char>>(poVar5);
                                              printHelp(this);
                                              goto LAB_0011c8ad;
                                            }
                                            pvVar4 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::at(args,(long)(iVar6 + 1));
                                            iVar3 = std::__cxx11::stoi(pvVar4,(size_t *)0x0,10);
                                            this->dsub = (long)iVar3;
                                            goto LAB_0011c19f;
                                          }
                                          this->qout = true;
                                        }
                                      }
                                    }
                                    iVar6 = iVar6 + -1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011c19f:
  iVar6 = iVar6 + 2;
  goto LAB_0011c0e9;
}

Assistant:

void Args::parseArgs(const std::vector<std::string>& args) {
  std::string command(args[1]);
  if (command == "supervised") {
    model = model_name::sup;
    loss = loss_name::softmax;
    minCount = 1;
    minn = 0;
    maxn = 0;
    lr = 0.1;
  } else if (command == "cbow") {
    model = model_name::cbow;
  }
  for (int ai = 2; ai < args.size(); ai += 2) {
    if (args[ai][0] != '-') {
      std::cerr << "Provided argument without a dash! Usage:" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
    try {
      if (args[ai] == "-h") {
        std::cerr << "Here is the help! Usage:" << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      } else if (args[ai] == "-input") {
        input = std::string(args.at(ai + 1));
      } else if (args[ai] == "-output") {
        output = std::string(args.at(ai + 1));
      } else if (args[ai] == "-lr") {
        lr = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-lrUpdateRate") {
        lrUpdateRate = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dim") {
        dim = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-ws") {
        ws = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-epoch") {
        epoch = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCount") {
        minCount = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minCountLabel") {
        minCountLabel = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-neg") {
        neg = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-wordNgrams") {
        wordNgrams = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-loss") {
        if (args.at(ai + 1) == "hs") {
          loss = loss_name::hs;
        } else if (args.at(ai + 1) == "ns") {
          loss = loss_name::ns;
        } else if (args.at(ai + 1) == "softmax") {
          loss = loss_name::softmax;
        } else {
          std::cerr << "Unknown loss: " << args.at(ai + 1) << std::endl;
          printHelp();
          exit(EXIT_FAILURE);
        }
      } else if (args[ai] == "-bucket") {
        bucket = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-minn") {
        minn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-maxn") {
        maxn = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-thread") {
        thread = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-t") {
        t = std::stof(args.at(ai + 1));
      } else if (args[ai] == "-label") {
        label = std::string(args.at(ai + 1));
      } else if (args[ai] == "-verbose") {
        verbose = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-pretrainedVectors") {
        pretrainedVectors = std::string(args.at(ai + 1));
      } else if (args[ai] == "-saveOutput") {
        saveOutput = true;
        ai--;
      } else if (args[ai] == "-qnorm") {
        qnorm = true;
        ai--;
      } else if (args[ai] == "-retrain") {
        retrain = true;
        ai--;
      } else if (args[ai] == "-qout") {
        qout = true;
        ai--;
      } else if (args[ai] == "-cutoff") {
        cutoff = std::stoi(args.at(ai + 1));
      } else if (args[ai] == "-dsub") {
        dsub = std::stoi(args.at(ai + 1));
      } else {
        std::cerr << "Unknown argument: " << args[ai] << std::endl;
        printHelp();
        exit(EXIT_FAILURE);
      }
    } catch (std::out_of_range) {
      std::cerr << args[ai] << " is missing an argument" << std::endl;
      printHelp();
      exit(EXIT_FAILURE);
    }
  }
  if (input.empty() || output.empty()) {
    std::cerr << "Empty input or output path." << std::endl;
    printHelp();
    exit(EXIT_FAILURE);
  }
  if (wordNgrams <= 1 && maxn == 0) {
    bucket = 0;
  }
}